

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::handleVariable(HlslParseContext *this,TSourceLoc *loc,TString *string)

{
  pointer ppTVar1;
  TIntermediate *pTVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TSymbol *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar8;
  long *plVar9;
  TVariable *this_00;
  TIntermSymbol *pTVar10;
  TIntermConstantUnion *index;
  undefined4 extraout_var_02;
  TTypeList *pTVar11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long lVar12;
  char *pcVar13;
  TSourceLoc *s;
  int thisDepth;
  TType local_c8;
  undefined4 extraout_var_01;
  
  pTVar7 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,string,&thisDepth);
  if (pTVar7 == (TSymbol *)0x0) {
LAB_003112c2:
    s = loc;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unknown variable",(string->_M_dataplus)._M_p);
    this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)s);
    TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
    TVariable::TVariable(this_00,string,&local_c8,false);
  }
  else {
    iVar4 = (*pTVar7->_vptr_TSymbol[9])(pTVar7);
    if (CONCAT44(extraout_var,iVar4) != 0) {
      iVar4 = (*pTVar7->_vptr_TSymbol[9])(pTVar7);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0xb0))
                        ((long *)CONCAT44(extraout_var_00,iVar4));
      if (cVar3 != '\0') {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"expected symbol, not user-defined type",(string->_M_dataplus)._M_p,"");
        return (TIntermTyped *)0x0;
      }
    }
    iVar4 = (*pTVar7->_vptr_TSymbol[0xb])(pTVar7);
    plVar8 = (long *)CONCAT44(extraout_var_01,iVar4);
    if (plVar8 != (long *)0x0) {
      if ((long)thisDepth < 1) {
LAB_0031113b:
        plVar9 = (long *)(**(code **)(*plVar8 + 0xb0))(plVar8);
        this_00 = (TVariable *)(**(code **)(*plVar9 + 0x50))(plVar9);
      }
      else {
        ppTVar1 = (this->implicitThisStack).
                  super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                  .
                  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this_00 = ppTVar1[((ulong)((long)(this->implicitThisStack).
                                         super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                         .
                                         super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1)
                          >> 3) - (long)thisDepth];
        if (this_00 == (TVariable *)0x0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot access member variables (static member function?)","this","");
          goto LAB_0031113b;
        }
      }
      pTVar10 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,this_00
                           ,loc);
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      uVar5 = (**(code **)(*plVar8 + 0xb8))(plVar8);
      index = TIntermediate::addConstantUnion(pTVar2,uVar5,loc,false);
      pTVar10 = (TIntermSymbol *)
                TIntermediate::addIndex
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           EOpIndexDirectStruct,&pTVar10->super_TIntermTyped,
                           &index->super_TIntermTyped,loc);
      iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
      pTVar11 = TType::getStruct((TType *)CONCAT44(extraout_var_02,iVar4));
      uVar5 = (**(code **)(*plVar8 + 0xb8))(plVar8);
      (*(pTVar10->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                (pTVar10,(pTVar11->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].type);
      iVar4 = (*(pTVar10->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar10);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x18))
                        ((long *)CONCAT44(extraout_var_03,iVar4));
      if (cVar3 != '\0') {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"member of nameless block was not redeclared",(string->_M_dataplus)._M_p
                   ,"");
      }
      goto LAB_00311392;
    }
    iVar4 = (*pTVar7->_vptr_TSymbol[9])(pTVar7);
    this_00 = (TVariable *)CONCAT44(extraout_var_04,iVar4);
    if (this_00 == (TVariable *)0x0) {
      pcVar13 = "variable name expected";
LAB_003112a5:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,pcVar13,(string->_M_dataplus)._M_p,"");
      goto LAB_003112c2;
    }
    iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
    iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x38))
                      ((long *)CONCAT44(extraout_var_05,iVar4));
    if (iVar4 == 0x10) {
LAB_00311277:
      iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
      pTVar11 = TType::getStruct((TType *)CONCAT44(extraout_var_07,iVar4));
      if (pTVar11 == (TTypeList *)0x0) {
        pcVar13 = "cannot be used (maybe an instance name is needed)";
        goto LAB_003112a5;
      }
    }
    else {
      iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
      iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x38))
                        ((long *)CONCAT44(extraout_var_06,iVar4));
      if (iVar4 == 0xf) goto LAB_00311277;
    }
  }
  iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x58))
                     ((long *)CONCAT44(extraout_var_08,iVar4));
  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  if ((*(ulong *)(lVar12 + 8) & 0x10000007f) == 2) {
    iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0x17])(this_00);
    iVar6 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
    pTVar10 = (TIntermSymbol *)
              TIntermediate::addConstantUnion
                        (pTVar2,(TConstUnionArray *)CONCAT44(extraout_var_09,iVar4),
                         (TType *)CONCAT44(extraout_var_10,iVar6),loc,false);
  }
  else {
    pTVar10 = TIntermediate::addSymbol(pTVar2,this_00,loc);
  }
LAB_00311392:
  iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[0xc])(this_00);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x58))
                     ((long *)CONCAT44(extraout_var_11,iVar4));
  if (((*(uint *)(lVar12 + 8) & 0x7f) < 0x1f) &&
     ((0x7ff00078U >> (*(uint *)(lVar12 + 8) & 0x1f) & 1) != 0)) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
    ::
    _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
              ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                *)&((this->super_TParseContextBase).super_TParseVersions.intermediate)->ioAccessed,
               string);
  }
  return &pTVar10->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::handleVariable(const TSourceLoc& loc, const TString* string)
{
    int thisDepth;
    TSymbol* symbol = symbolTable.find(*string, thisDepth);
    if (symbol && symbol->getAsVariable() && symbol->getAsVariable()->isUserType()) {
        error(loc, "expected symbol, not user-defined type", string->c_str(), "");
        return nullptr;
    }

    const TVariable* variable = nullptr;
    const TAnonMember* anon = symbol ? symbol->getAsAnonMember() : nullptr;
    TIntermTyped* node = nullptr;
    if (anon) {
        // It was a member of an anonymous container, which could be a 'this' structure.

        // Create a subtree for its dereference.
        if (thisDepth > 0) {
            variable = getImplicitThis(thisDepth);
            if (variable == nullptr)
                error(loc, "cannot access member variables (static member function?)", "this", "");
        }
        if (variable == nullptr)
            variable = anon->getAnonContainer().getAsVariable();

        TIntermTyped* container = intermediate.addSymbol(*variable, loc);
        TIntermTyped* constNode = intermediate.addConstantUnion(anon->getMemberNumber(), loc);
        node = intermediate.addIndex(EOpIndexDirectStruct, container, constNode, loc);

        node->setType(*(*variable->getType().getStruct())[anon->getMemberNumber()].type);
        if (node->getType().hiddenMember())
            error(loc, "member of nameless block was not redeclared", string->c_str(), "");
    } else {
        // Not a member of an anonymous container.

        // The symbol table search was done in the lexical phase.
        // See if it was a variable.
        variable = symbol ? symbol->getAsVariable() : nullptr;
        if (variable) {
            if ((variable->getType().getBasicType() == EbtBlock ||
                variable->getType().getBasicType() == EbtStruct) && variable->getType().getStruct() == nullptr) {
                error(loc, "cannot be used (maybe an instance name is needed)", string->c_str(), "");
                variable = nullptr;
            }
        } else {
            if (symbol)
                error(loc, "variable name expected", string->c_str(), "");
        }

        // Recovery, if it wasn't found or was not a variable.
        if (variable == nullptr) {
            error(loc, "unknown variable", string->c_str(), "");
            variable = new TVariable(string, TType(EbtVoid));
        }

        if (variable->getType().getQualifier().isFrontEndConstant())
            node = intermediate.addConstantUnion(variable->getConstArray(), variable->getType(), loc);
        else
            node = intermediate.addSymbol(*variable, loc);
    }

    if (variable->getType().getQualifier().isIo())
        intermediate.addIoAccessed(*string);

    return node;
}